

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::PipelineStateGLImpl::DvpVerifySRBResources
          (PipelineStateGLImpl *this,ShaderResourceCacheArrayType *ResourceCaches,
          BaseBindingsArrayType *BaseBindings)

{
  bool bVar1;
  Uint32 UVar2;
  Uint32 UVar3;
  TBindings *__one;
  const_reference __two;
  Char *pCVar4;
  char (*pacVar5) [49];
  char (*Args_1) [49];
  char (*pacVar6) [56];
  char (*Args_1_00) [56];
  __shared_ptr_access<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  element_type *this_01;
  reference_wrapper<HandleResourceHelper> HandleUB;
  reference_wrapper<HandleResourceHelper> HandleTexture;
  reference_wrapper<HandleResourceHelper> HandleImg;
  reference_wrapper<HandleResourceHelper> HandleSB;
  undefined1 local_f0 [8];
  string msg_2;
  undefined1 local_a8 [8];
  string msg_1;
  undefined1 local_80 [8];
  HandleResourceHelper HandleResource;
  Uint32 ShaderInd;
  undefined1 local_50 [8];
  string msg;
  PipelineResourceSignatureImplType *pSignature;
  Uint32 sign;
  Uint32 SignCount;
  BaseBindingsArrayType *BaseBindings_local;
  ShaderResourceCacheArrayType *ResourceCaches_local;
  PipelineStateGLImpl *this_local;
  
  UVar2 = PipelineStateBase<Diligent::EngineGLImplTraits>::GetResourceSignatureCount
                    (&this->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
  for (pSignature._0_4_ = 0; (uint)pSignature < UVar2; pSignature._0_4_ = (uint)pSignature + 1) {
    msg.field_2._8_8_ =
         PipelineStateBase<Diligent::EngineGLImplTraits>::GetResourceSignature
                   (&this->super_PipelineStateBase<Diligent::EngineGLImplTraits>,(uint)pSignature);
    if (((PipelineResourceSignatureImplType *)msg.field_2._8_8_ !=
         (PipelineResourceSignatureImplType *)0x0) &&
       (UVar3 = PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::GetTotalResourceCount
                          ((PipelineResourceSignatureBase<Diligent::EngineGLImplTraits> *)
                           msg.field_2._8_8_), UVar3 != 0)) {
      __one = GetBaseBindings(this,(uint)pSignature);
      __two = std::array<std::array<unsigned_short,_4UL>,_8UL>::operator[]
                        (BaseBindings,(ulong)(uint)pSignature);
      bVar1 = std::operator==(__one,__two);
      if (!bVar1) {
        FormatString<char[124]>
                  ((string *)local_50,
                   (char (*) [124])
                   "Bound resources use incorrect base binding indices. This may indicate a bug in resource signature compatibility comparison."
                  );
        pCVar4 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar4,"DvpVerifySRBResources",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
                   ,0x2e9);
        std::__cxx11::string::~string((string *)local_50);
      }
    }
  }
  HandleResource.shader_ind._0_4_ = 0;
  msg_1.field_2._8_8_ =
       std::
       vector<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution>_>
       ::begin(&this->m_ResourceAttibutions);
  DvpVerifySRBResources(std::array<Diligent::ShaderResourceCacheGL*,8ul>const&,std::array<std::array<unsigned_short,4ul>,8ul>const&)
  ::ResourceAttribution>_>_>_unsigned_int__
            (local_80,this,ResourceCaches,(AttribIter)msg_1.field_2._8_8_,
             (Uint32 *)&HandleResource.shader_ind);
  pacVar5 = (char (*) [49])
            std::
            vector<std::shared_ptr<const_Diligent::ShaderResourcesGL>,_std::allocator<std::shared_ptr<const_Diligent::ShaderResourcesGL>_>_>
            ::size(&this->m_ShaderResources);
  Args_1 = (char (*) [49])
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size(&this->m_ShaderNames);
  if (pacVar5 != Args_1) {
    FormatString<char[26],char[49]>
              ((string *)local_a8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_ShaderResources.size() == m_ShaderNames.size()",Args_1);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"DvpVerifySRBResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0x313);
    std::__cxx11::string::~string((string *)local_a8);
  }
  for (; pacVar6 = (char (*) [56])(ulong)(uint)HandleResource.shader_ind,
      Args_1_00 = (char (*) [56])
                  std::
                  vector<std::shared_ptr<const_Diligent::ShaderResourcesGL>,_std::allocator<std::shared_ptr<const_Diligent::ShaderResourcesGL>_>_>
                  ::size(&this->m_ShaderResources), pacVar6 < Args_1_00;
      HandleResource.shader_ind._0_4_ = (uint)HandleResource.shader_ind + 1) {
    this_00 = (__shared_ptr_access<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::
                 vector<std::shared_ptr<const_Diligent::ShaderResourcesGL>,_std::allocator<std::shared_ptr<const_Diligent::ShaderResourcesGL>_>_>
                 ::operator[](&this->m_ShaderResources,(ulong)(uint)HandleResource.shader_ind);
    this_01 = std::
              __shared_ptr_access<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(this_00);
    HandleUB = std::
               ref<Diligent::PipelineStateGLImpl::DvpVerifySRBResources(std::array<Diligent::ShaderResourceCacheGL*,8ul>const&,std::array<std::array<unsigned_short,4ul>,8ul>const&)const::HandleResourceHelper>
                         ((HandleResourceHelper *)local_80);
    HandleTexture =
         std::
         ref<Diligent::PipelineStateGLImpl::DvpVerifySRBResources(std::array<Diligent::ShaderResourceCacheGL*,8ul>const&,std::array<std::array<unsigned_short,4ul>,8ul>const&)const::HandleResourceHelper>
                   ((HandleResourceHelper *)local_80);
    HandleImg = std::
                ref<Diligent::PipelineStateGLImpl::DvpVerifySRBResources(std::array<Diligent::ShaderResourceCacheGL*,8ul>const&,std::array<std::array<unsigned_short,4ul>,8ul>const&)const::HandleResourceHelper>
                          ((HandleResourceHelper *)local_80);
    HandleSB = std::
               ref<Diligent::PipelineStateGLImpl::DvpVerifySRBResources(std::array<Diligent::ShaderResourceCacheGL*,8ul>const&,std::array<std::array<unsigned_short,4ul>,8ul>const&)const::HandleResourceHelper>
                         ((HandleResourceHelper *)local_80);
    ShaderResourcesGL::
    ProcessConstResources<std::reference_wrapper<Diligent::PipelineStateGLImpl::DvpVerifySRBResources(std::array<Diligent::ShaderResourceCacheGL*,8ul>const&,std::array<std::array<unsigned_short,4ul>,8ul>const&)const::HandleResourceHelper>,std::reference_wrapper<Diligent::PipelineStateGLImpl::DvpVerifySRBResources(std::array<Diligent::ShaderResourceCacheGL*,8ul>const&,std::array<std::array<unsigned_short,4ul>,8ul>const&)const::HandleResourceHelper>,std::reference_wrapper<Diligent::PipelineStateGLImpl::DvpVerifySRBResources(std::array<Diligent::ShaderResourceCacheGL*,8ul>const&,std::array<std::array<unsigned_short,4ul>,8ul>const&)const::HandleResourceHelper>,std::reference_wrapper<Diligent::PipelineStateGLImpl::DvpVerifySRBResources(std::array<Diligent::ShaderResourceCacheGL*,8ul>const&,std::array<std::array<unsigned_short,4ul>,8ul>const&)const::HandleResourceHelper>>
              (this_01,HandleUB,HandleTexture,HandleImg,HandleSB,(PipelineResourceLayoutDesc *)0x0,
               (SHADER_RESOURCE_VARIABLE_TYPE *)0x0,0);
  }
  msg_2.field_2._8_8_ =
       std::
       vector<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution>_>
       ::end(&this->m_ResourceAttibutions);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<const_Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution_*,_std::vector<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution>_>_>
                      *)&HandleResource.ResourceCaches,
                     (__normal_iterator<const_Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution_*,_std::vector<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution>_>_>
                      *)((long)&msg_2.field_2 + 8));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    FormatString<char[26],char[56]>
              ((string *)local_f0,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"HandleResource.attrib_it == m_ResourceAttibutions.end()",Args_1_00);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"DvpVerifySRBResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0x319);
    std::__cxx11::string::~string((string *)local_f0);
  }
  return;
}

Assistant:

void PipelineStateGLImpl::DvpVerifySRBResources(const ShaderResourceCacheArrayType& ResourceCaches,
                                                const BaseBindingsArrayType&        BaseBindings) const
{
    // Verify base bindings
    const auto SignCount = GetResourceSignatureCount();
    for (Uint32 sign = 0; sign < SignCount; ++sign)
    {
        const auto* pSignature = GetResourceSignature(sign);
        if (pSignature == nullptr || pSignature->GetTotalResourceCount() == 0)
            continue;

        DEV_CHECK_ERR(GetBaseBindings(sign) == BaseBindings[sign],
                      "Bound resources use incorrect base binding indices. This may indicate a bug in resource signature compatibility comparison.");
    }

    using AttribIter = std::vector<ResourceAttribution>::const_iterator;
    struct HandleResourceHelper
    {
        PipelineStateGLImpl const&          PSO;
        const ShaderResourceCacheArrayType& ResourceCaches;
        AttribIter                          attrib_it;
        Uint32&                             shader_ind;

        HandleResourceHelper(const PipelineStateGLImpl&          _PSO,
                             const ShaderResourceCacheArrayType& _ResourceCaches,
                             AttribIter                          _iter,
                             Uint32&                             _ind) :
            PSO{_PSO},
            ResourceCaches{_ResourceCaches},
            attrib_it{_iter},
            shader_ind{_ind}
        {}

        void Validate(const ShaderResourcesGL::GLResourceAttribs& Attribs, RESOURCE_DIMENSION ResDim, bool IsMS)
        {
            if (*attrib_it && !attrib_it->IsImmutableSampler())
            {
                const auto* pResourceCache = ResourceCaches[attrib_it->SignatureIndex];
                DEV_CHECK_ERR(pResourceCache != nullptr, "Resource cache at index ", attrib_it->SignatureIndex, " is null.");
                attrib_it->pSignature->DvpValidateCommittedResource(Attribs, ResDim, IsMS, attrib_it->ResourceIndex, *pResourceCache,
                                                                    PSO.m_ShaderNames[shader_ind].c_str(), PSO.m_Desc.Name);
            }
            ++attrib_it;
        }

        void operator()(const ShaderResourcesGL::StorageBlockInfo& Attribs) { Validate(Attribs, RESOURCE_DIM_BUFFER, false); }
        void operator()(const ShaderResourcesGL::UniformBufferInfo& Attribs) { Validate(Attribs, RESOURCE_DIM_BUFFER, false); }
        void operator()(const ShaderResourcesGL::TextureInfo& Attribs) { Validate(Attribs, Attribs.ResourceDim, Attribs.IsMultisample); }
        void operator()(const ShaderResourcesGL::ImageInfo& Attribs) { Validate(Attribs, Attribs.ResourceDim, Attribs.IsMultisample); }
    };

    Uint32               ShaderInd = 0;
    HandleResourceHelper HandleResource{*this, ResourceCaches, m_ResourceAttibutions.begin(), ShaderInd};

    VERIFY_EXPR(m_ShaderResources.size() == m_ShaderNames.size());
    for (; ShaderInd < m_ShaderResources.size(); ++ShaderInd)
    {
        m_ShaderResources[ShaderInd]->ProcessConstResources(std::ref(HandleResource), std::ref(HandleResource),
                                                            std::ref(HandleResource), std::ref(HandleResource));
    }
    VERIFY_EXPR(HandleResource.attrib_it == m_ResourceAttibutions.end());
}